

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O2

int __thiscall
vkt::compute::anon_unknown_0::ComputeShaderBuiltinVarTests::init
          (ComputeShaderBuiltinVarTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *pTVar1;
  int extraout_EAX;
  ComputeBuiltinVarCase *pCVar2;
  uint uVar3;
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  *pvVar4;
  UVec3 local_68;
  UVec3 local_5c;
  SubCase local_50;
  TestNode *local_38;
  
  pCVar2 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  local_38 = (TestNode *)this;
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"num_work_groups",
             "gl_NumWorkGroups",TYPE_UINT_VEC3);
  (pCVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00bd8c20;
  pvVar4 = &pCVar2->m_subCases;
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  uVar3 = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 0x34;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 0x27;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 0x4e;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  pTVar1 = local_38;
  tcu::TestNode::addChild(local_38,(TestNode *)pCVar2);
  pCVar2 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar2,pTVar1->m_testCtx,"work_group_size","gl_WorkGroupSize",TYPE_UINT_VEC3);
  (pCVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00bd8d30;
  pvVar4 = &pCVar2->m_subCases;
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 2;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 3;
  local_68.m_data[2] = 5;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 3;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 7;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 7;
  local_68.m_data[0] = 3;
  local_68.m_data[1] = 3;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 3;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 2;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  pTVar1 = local_38;
  tcu::TestNode::addChild(local_38,(TestNode *)pCVar2);
  pCVar2 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar2,pTVar1->m_testCtx,"work_group_id","gl_WorkGroupID",TYPE_UINT_VEC3);
  (pCVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00bd8d98;
  pvVar4 = &pCVar2->m_subCases;
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 0x34;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 0x27;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 0x4e;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  pTVar1 = local_38;
  tcu::TestNode::addChild(local_38,(TestNode *)pCVar2);
  pCVar2 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar2,pTVar1->m_testCtx,"local_invocation_id","gl_LocalInvocationID",TYPE_UINT_VEC3);
  (pCVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00bd8e00;
  pvVar4 = &pCVar2->m_subCases;
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 2;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 3;
  local_68.m_data[2] = 5;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 3;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 7;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 7;
  local_68.m_data[0] = 3;
  local_68.m_data[1] = 3;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 3;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 2;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  pTVar1 = local_38;
  tcu::TestNode::addChild(local_38,(TestNode *)pCVar2);
  pCVar2 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar2,pTVar1->m_testCtx,"global_invocation_id","gl_GlobalInvocationID",TYPE_UINT_VEC3)
  ;
  (pCVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00bd8e68;
  pvVar4 = &pCVar2->m_subCases;
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 0x34;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 0x27;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 0x4e;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 3;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 2;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  pTVar1 = local_38;
  tcu::TestNode::addChild(local_38,(TestNode *)pCVar2);
  pCVar2 = (ComputeBuiltinVarCase *)operator_new(0xb0);
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (pCVar2,pTVar1->m_testCtx,"local_invocation_index","gl_LocalInvocationIndex",TYPE_UINT);
  (pCVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00bd8ed0;
  pvVar4 = &pCVar2->m_subCases;
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 0x27;
  local_68.m_data[2] = uVar3;
  local_5c.m_data[2] = uVar3;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 1;
  local_5c.m_data[1] = 1;
  local_5c.m_data[2] = 1;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 2;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 4;
  local_68.m_data[1] = 7;
  local_68.m_data[2] = 0xb;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 1;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 1;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  local_5c.m_data[0] = 10;
  local_5c.m_data[1] = 3;
  local_5c.m_data[2] = 4;
  local_68.m_data[0] = 3;
  local_68.m_data[1] = 1;
  local_68.m_data[2] = 2;
  SubCase::SubCase(&local_50,&local_5c,&local_68);
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::push_back(pvVar4,&local_50);
  tcu::TestNode::addChild(local_38,(TestNode *)pCVar2);
  return extraout_EAX;
}

Assistant:

void ComputeShaderBuiltinVarTests::init (void)
{
	addChild(new NumWorkGroupsCase(this->getTestContext()));
	addChild(new WorkGroupSizeCase(this->getTestContext()));
	addChild(new WorkGroupIDCase(this->getTestContext()));
	addChild(new LocalInvocationIDCase(this->getTestContext()));
	addChild(new GlobalInvocationIDCase(this->getTestContext()));
	addChild(new LocalInvocationIndexCase(this->getTestContext()));
}